

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_common.c
# Opt level: O2

int nng_tls_engine_register(nng_tls_engine *engine)

{
  return 9;
}

Assistant:

int
nng_tls_engine_register(const nng_tls_engine *engine)
{
	if (engine->version != NNG_TLS_ENGINE_VERSION) {
		nng_log_err("NNG-TLS-ENGINE-VER",
		    "TLS Engine version mismatch: %d != %d", engine->version,
		    NNG_TLS_ENGINE_VERSION);
		return (NNG_ENOTSUP);
	}
	nng_log_info("NNG-TLS-INFO", "TLS Engine: %s", engine->description);
	nni_atomic_set_ptr(&tls_engine, (void *) engine);
	return (0);
}